

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,string *classname,Descriptor *desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  allocator *paVar2;
  char *pcVar3;
  long lVar4;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           (*(long *)(*(long *)(desc + 0x10) + 0xa0) + 0x98);
  bVar1 = std::operator!=(__lhs,"");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__lhs);
  }
  else {
    lVar4 = 0;
    do {
      if (lVar4 == 0x10) {
        pcVar3 = "";
        paVar2 = &local_2b;
        goto LAB_0026624a;
      }
      bVar1 = std::operator==(classname,*(char **)((long)kReservedNames + lVar4));
      lVar4 = lVar4 + 8;
    } while (!bVar1);
    bVar1 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (*(long *)(desc + 0x10) + 8),"google.protobuf");
    if (bVar1) {
      pcVar3 = "GPB";
      paVar2 = &local_29;
    }
    else {
      pcVar3 = "PB";
      paVar2 = &local_2a;
    }
LAB_0026624a:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (prefix != "") {
    return prefix;
  }

  bool is_reserved = false;

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (classname == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (desc->file()->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}